

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O3

int sethook(lua_State *L)

{
  uint uVar1;
  int iVar2;
  char *scpt;
  char *pcVar3;
  lua_Integer lVar4;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  
  iVar2 = lua_type(L,1);
  if (iVar2 < 1) {
    lua_sethook(L,(lua_Hook)0x0,0,0);
  }
  else {
    scpt = luaL_checklstring(L,1,(size_t *)0x0);
    pcVar3 = luaL_checklstring(L,2,(size_t *)0x0);
    lVar4 = luaL_optinteger(L,3,0);
    pcVar5 = strchr(pcVar3,99);
    pcVar6 = strchr(pcVar3,0x72);
    uVar7 = (pcVar5 != (char *)0x0) + 2;
    if (pcVar6 == (char *)0x0) {
      uVar7 = (uint)(pcVar5 != (char *)0x0);
    }
    pcVar3 = strchr(pcVar3,0x6c);
    uVar1 = uVar7 + 4;
    if (pcVar3 == (char *)0x0) {
      uVar1 = uVar7;
    }
    uVar7 = uVar1 + 8;
    if ((int)lVar4 < 1) {
      uVar7 = uVar1;
    }
    sethookaux(L,uVar7,(int)lVar4,scpt);
  }
  return 0;
}

Assistant:

static int sethook (lua_State *L) {
  if (lua_isnoneornil(L, 1))
    lua_sethook(L, NULL, 0, 0);  /* turn off hooks */
  else {
    const char *scpt = luaL_checkstring(L, 1);
    const char *smask = luaL_checkstring(L, 2);
    int count = cast_int(luaL_optinteger(L, 3, 0));
    int mask = 0;
    if (strchr(smask, 'c')) mask |= LUA_MASKCALL;
    if (strchr(smask, 'r')) mask |= LUA_MASKRET;
    if (strchr(smask, 'l')) mask |= LUA_MASKLINE;
    if (count > 0) mask |= LUA_MASKCOUNT;
    sethookaux(L, mask, count, scpt);
  }
  return 0;
}